

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Matrix * MatrixLookAt(Matrix *__return_storage_ptr__,Vector3 eye,Vector3 target,Vector3 up)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar4 = eye.z;
  fVar2 = eye.x;
  fVar3 = eye.y;
  fVar8 = fVar4 - target.z;
  fVar11 = fVar2 - target.x;
  fVar13 = fVar3 - target.y;
  fVar5 = SQRT(fVar8 * fVar8 + fVar11 * fVar11 + fVar13 * fVar13);
  uVar1 = -(uint)(fVar5 == 0.0);
  fVar5 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar5));
  fVar11 = fVar5 * fVar11;
  fVar13 = fVar5 * fVar13;
  fVar5 = fVar5 * fVar8;
  fVar9 = up.y * fVar5 - fVar13 * up.z;
  fVar6 = up.z * fVar11 - fVar5 * up.x;
  fVar7 = up.x * fVar13 - fVar11 * up.y;
  fVar8 = SQRT(fVar7 * fVar7 + fVar9 * fVar9 + fVar6 * fVar6);
  uVar1 = -(uint)(fVar8 == 0.0);
  fVar8 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar8));
  fVar9 = fVar8 * fVar9;
  fVar6 = fVar8 * fVar6;
  fVar8 = fVar8 * fVar7;
  fVar7 = fVar13 * fVar8 - fVar6 * fVar5;
  fVar10 = fVar5 * fVar9 - fVar8 * fVar11;
  __return_storage_ptr__->m0 = fVar9;
  __return_storage_ptr__->m1 = fVar7;
  __return_storage_ptr__->m5 = fVar10;
  __return_storage_ptr__->m2 = fVar11;
  __return_storage_ptr__->m6 = fVar13;
  fVar12 = fVar11 * fVar6 - fVar9 * fVar13;
  __return_storage_ptr__->m4 = fVar6;
  __return_storage_ptr__->m8 = fVar8;
  __return_storage_ptr__->m9 = fVar12;
  __return_storage_ptr__->m10 = fVar5;
  __return_storage_ptr__->m12 = -(fVar8 * fVar4 + fVar9 * fVar2 + fVar6 * fVar3);
  __return_storage_ptr__->m13 = -(fVar12 * fVar4 + fVar7 * fVar2 + fVar10 * fVar3);
  __return_storage_ptr__->m14 = -(fVar5 * fVar4 + fVar11 * fVar2 + fVar13 * fVar3);
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  return __return_storage_ptr__;
}

Assistant:

RMAPI Matrix MatrixLookAt(Vector3 eye, Vector3 target, Vector3 up)
{
    Matrix result = { 0 };

    float length = 0.0f;
    float ilength = 0.0f;

    // Vector3Subtract(eye, target)
    Vector3 vz = { eye.x - target.x, eye.y - target.y, eye.z - target.z };

    // Vector3Normalize(vz)
    Vector3 v = vz;
    length = sqrtf(v.x*v.x + v.y*v.y + v.z*v.z);
    if (length == 0.0f) length = 1.0f;
    ilength = 1.0f/length;
    vz.x *= ilength;
    vz.y *= ilength;
    vz.z *= ilength;

    // Vector3CrossProduct(up, vz)
    Vector3 vx = { up.y*vz.z - up.z*vz.y, up.z*vz.x - up.x*vz.z, up.x*vz.y - up.y*vz.x };

    // Vector3Normalize(x)
    v = vx;
    length = sqrtf(v.x*v.x + v.y*v.y + v.z*v.z);
    if (length == 0.0f) length = 1.0f;
    ilength = 1.0f/length;
    vx.x *= ilength;
    vx.y *= ilength;
    vx.z *= ilength;

    // Vector3CrossProduct(vz, vx)
    Vector3 vy = { vz.y*vx.z - vz.z*vx.y, vz.z*vx.x - vz.x*vx.z, vz.x*vx.y - vz.y*vx.x };

    result.m0 = vx.x;
    result.m1 = vy.x;
    result.m2 = vz.x;
    result.m3 = 0.0f;
    result.m4 = vx.y;
    result.m5 = vy.y;
    result.m6 = vz.y;
    result.m7 = 0.0f;
    result.m8 = vx.z;
    result.m9 = vy.z;
    result.m10 = vz.z;
    result.m11 = 0.0f;
    result.m12 = -(vx.x*eye.x + vx.y*eye.y + vx.z*eye.z);   // Vector3DotProduct(vx, eye)
    result.m13 = -(vy.x*eye.x + vy.y*eye.y + vy.z*eye.z);   // Vector3DotProduct(vy, eye)
    result.m14 = -(vz.x*eye.x + vz.y*eye.y + vz.z*eye.z);   // Vector3DotProduct(vz, eye)
    result.m15 = 1.0f;

    return result;
}